

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPerm.c
# Opt level: O2

int Abc_ZddMinUnion(Abc_ZddMan *p,int a,int b)

{
  Abc_ZddObj *pAVar1;
  Abc_ZddObj *pAVar2;
  Abc_ZddObj *pAVar3;
  int iVar4;
  uint uVar5;
  int True;
  int Arg0;
  
  do {
    Arg0 = a;
    a = b;
    if (Arg0 == 0) {
      return a;
    }
    if (a == 0) {
      return Arg0;
    }
    if (Arg0 == a) {
      return Arg0;
    }
    b = Arg0;
  } while (a < Arg0);
  iVar4 = Abc_ZddCacheLookup(p,Arg0,a,3);
  if (iVar4 < 0) {
    pAVar3 = p->pObjs;
    pAVar1 = pAVar3 + Arg0;
    pAVar2 = pAVar3 + a;
    if ((*(uint *)(pAVar3 + Arg0) & 0x7fffffff) < (*(uint *)(pAVar3 + a) & 0x7fffffff)) {
      iVar4 = Abc_ZddMinUnion(p,pAVar1->False,a);
      uVar5 = pAVar1->True;
    }
    else if ((*(uint *)(pAVar3 + a) & 0x7fffffff) < (*(uint *)(pAVar3 + Arg0) & 0x7fffffff)) {
      iVar4 = Abc_ZddMinUnion(p,Arg0,pAVar2->False);
      uVar5 = pAVar2->True;
    }
    else {
      iVar4 = Abc_ZddMinUnion(p,pAVar1->False,pAVar2->False);
      uVar5 = Abc_ZddMinUnion(p,pAVar1->True,pAVar2->True);
    }
    True = Abc_ZddDiff(p,uVar5,iVar4);
    uVar5 = *(uint *)pAVar2 & 0x7fffffff;
    if ((*(uint *)pAVar1 & 0x7fffffff) < (*(uint *)pAVar2 & 0x7fffffff)) {
      uVar5 = *(uint *)pAVar1 & 0x7fffffff;
    }
    iVar4 = Abc_ZddUniqueCreate(p,uVar5,True,iVar4);
    Abc_ZddCacheInsert(p,Arg0,a,3,iVar4);
  }
  return iVar4;
}

Assistant:

int Abc_ZddMinUnion( Abc_ZddMan * p, int a, int b )
{
    Abc_ZddObj * A, * B; 
    int r0, r1, r;
    if ( a == 0 ) return b;
    if ( b == 0 ) return a;
    if ( a == b ) return a;
    if ( a > b )  return Abc_ZddMinUnion( p, b, a );
    if ( (r = Abc_ZddCacheLookup(p, a, b, ABC_ZDD_OPER_MIN_UNION)) >= 0 )
        return r;
    A = Abc_ZddNode( p, a );
    B = Abc_ZddNode( p, b );
    if ( A->Var < B->Var )
        r0 = Abc_ZddMinUnion( p, A->False, b ), 
        r1 = A->True;
    else if ( A->Var > B->Var )
        r0 = Abc_ZddMinUnion( p, a, B->False ), 
        r1 = B->True;
    else
        r0 = Abc_ZddMinUnion( p, A->False, B->False ), 
        r1 = Abc_ZddMinUnion( p, A->True, B->True );
    r1 = Abc_ZddDiff( p, r1, r0 ); // assume args are minimal
    r = Abc_ZddUniqueCreate( p, Abc_MinInt(A->Var, B->Var), r1, r0 );
    return Abc_ZddCacheInsert( p, a, b, ABC_ZDD_OPER_MIN_UNION, r );
}